

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O3

error_code __thiscall basisu::basis_compressor::encode_slices_to_uastc(basis_compressor *this)

{
  vector<basisu::gpu_image> *this_00;
  basisu_backend_slice_desc_vec *this_01;
  vector<basisu::vector<unsigned_char>_> *this_02;
  undefined8 *puVar1;
  gpu_image *pgVar2;
  void *pvVar3;
  basisu_backend_slice_desc *__dest;
  basisu_backend_slice_desc *__src;
  vector<unsigned_char> *pvVar4;
  job_pool *pjVar5;
  basis_compressor *pbVar6;
  bool bVar7;
  uint16_t uVar8;
  uint32_t total_jobs;
  uint uVar9;
  uint32_t uVar10;
  char *__function;
  uint uVar11;
  uint32_t new_size_3;
  uint uVar12;
  job_pool *pJob_pool;
  long lVar13;
  elemental_vector *this_03;
  uint32_t new_size;
  uint uVar14;
  ulong uVar15;
  uint32_t new_size_1;
  atomic<unsigned_int> total_blocks_processed;
  undefined1 local_90 [8];
  float local_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 local_78;
  uint32_t local_6c;
  uint32_t local_68;
  undefined4 local_64;
  basis_compressor *local_60;
  gpu_image *local_58;
  basisu_backend_slice_desc *local_50;
  long local_48;
  ulong local_40;
  image *local_38;
  
  debug_printf("basis_compressor::encode_slices_to_uastc\n");
  this_00 = &this->m_uastc_slice_textures;
  uVar14 = (this->m_slice_descs).m_size;
  uVar11 = (this->m_uastc_slice_textures).m_size;
  uVar9 = uVar11 - uVar14;
  if (uVar9 != 0) {
    if (uVar11 < uVar14 || uVar9 == 0) {
      if ((this->m_uastc_slice_textures).m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar14,uVar11 + 1 == uVar14,0x30,
                   vector<basisu::gpu_image>::object_mover,false);
        uVar11 = (this->m_uastc_slice_textures).m_size;
      }
      if (uVar14 - uVar11 != 0) {
        pgVar2 = this_00->m_p;
        lVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pgVar2[uVar11].m_blocks.m_p + lVar13);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pgVar2[uVar11].m_fmt + lVar13) = 0xffffffff;
          puVar1 = (undefined8 *)((long)&pgVar2[uVar11].m_width + lVar13);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)&pgVar2[uVar11].m_blocks_y + lVar13);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar13 = lVar13 + 0x30;
        } while ((ulong)(uVar14 - uVar11) * 0x30 != lVar13);
      }
    }
    else {
      pgVar2 = this_00->m_p;
      lVar13 = 0;
      do {
        pvVar3 = *(void **)((long)&pgVar2[uVar14].m_blocks.m_p + lVar13);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar13 = lVar13 + 0x30;
      } while ((ulong)uVar9 * 0x30 != lVar13);
    }
    (this->m_uastc_slice_textures).m_size = uVar14;
    uVar14 = (this->m_slice_descs).m_size;
  }
  if (uVar14 == 0) {
    (this->m_uastc_backend_output).m_tex_format = cUASTC4x4;
    (this->m_uastc_backend_output).m_etc1s = false;
  }
  else {
    lVar13 = 0;
    uVar15 = 0;
    do {
      if ((this->m_uastc_slice_textures).m_size <= uVar15) goto LAB_00213b8e;
      gpu_image::init((gpu_image *)((long)&((this->m_uastc_slice_textures).m_p)->m_fmt + lVar13),
                      (EVP_PKEY_CTX *)0x13);
      uVar15 = uVar15 + 1;
      uVar14 = (this->m_slice_descs).m_size;
      lVar13 = lVar13 + 0x30;
    } while (uVar15 < uVar14);
    (this->m_uastc_backend_output).m_tex_format = cUASTC4x4;
    (this->m_uastc_backend_output).m_etc1s = false;
    this_01 = &(this->m_uastc_backend_output).m_slice_desc;
    if ((this->m_uastc_backend_output).m_slice_desc.m_capacity < uVar14) {
      if (this_01->m_p != (basisu_backend_slice_desc *)0x0) {
        free(this_01->m_p);
        this_01->m_p = (basisu_backend_slice_desc *)0x0;
        (this->m_uastc_backend_output).m_slice_desc.m_size = 0;
        (this->m_uastc_backend_output).m_slice_desc.m_capacity = 0;
        uVar14 = (this->m_slice_descs).m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)this_01,uVar14,false,0x30,(object_mover)0x0,false);
      goto LAB_0021369a;
    }
  }
  if ((this->m_uastc_backend_output).m_slice_desc.m_size != 0) {
    (this->m_uastc_backend_output).m_slice_desc.m_size = 0;
  }
LAB_0021369a:
  __dest = (this->m_uastc_backend_output).m_slice_desc.m_p;
  if ((__dest != (basisu_backend_slice_desc *)0x0) &&
     (__src = (this->m_slice_descs).m_p, __src != (basisu_backend_slice_desc *)0x0)) {
    memcpy(__dest,__src,(ulong)(this->m_slice_descs).m_size * 0x30);
  }
  uVar14 = (this->m_slice_descs).m_size;
  (this->m_uastc_backend_output).m_slice_desc.m_size = uVar14;
  this_02 = &(this->m_uastc_backend_output).m_slice_image_data;
  uVar11 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
  uVar9 = uVar11 - uVar14;
  if (uVar9 != 0) {
    if (uVar11 < uVar14 || uVar9 == 0) {
      if ((this->m_uastc_backend_output).m_slice_image_data.m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_02,uVar14,uVar11 + 1 == uVar14,0x10,(object_mover)0x0,
                   false);
        uVar11 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
      }
      if (uVar14 - uVar11 != 0) {
        memset(this_02->m_p + uVar11,0,(ulong)(uVar14 - uVar11) << 4);
      }
    }
    else {
      pvVar4 = this_02->m_p;
      lVar13 = 0;
      do {
        pvVar3 = *(void **)((long)&pvVar4[uVar14].m_p + lVar13);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        lVar13 = lVar13 + 0x10;
      } while ((ulong)uVar9 << 4 != lVar13);
    }
    (this->m_uastc_backend_output).m_slice_image_data.m_size = uVar14;
    uVar14 = (this->m_slice_descs).m_size;
  }
  uVar11 = (this->m_uastc_backend_output).m_slice_image_crcs.m_size;
  uVar10 = uVar14;
  if (uVar11 != uVar14) {
    if (uVar11 <= uVar14) {
      if ((this->m_uastc_backend_output).m_slice_image_crcs.m_capacity < uVar14) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&(this->m_uastc_backend_output).m_slice_image_crcs,uVar14,
                   uVar11 + 1 == uVar14,2,(object_mover)0x0,false);
        uVar11 = (this->m_uastc_backend_output).m_slice_image_crcs.m_size;
      }
      memset((this->m_uastc_backend_output).m_slice_image_crcs.m_p + uVar11,0,
             (ulong)(uVar14 - uVar11) * 2);
      uVar10 = (this->m_slice_descs).m_size;
    }
    (this->m_uastc_backend_output).m_slice_image_crcs.m_size = uVar14;
  }
  if (uVar10 != 0) {
    uVar15 = 0;
    local_60 = this;
    do {
      if ((this->m_uastc_slice_textures).m_size <= (uint)uVar15) {
LAB_00213b8e:
        __function = 
        "T &basisu::vector<basisu::gpu_image>::operator[](size_t) [T = basisu::gpu_image]";
LAB_00213c30:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      if ((this->m_slice_images).m_size <= (uint)uVar15) {
        __function = "T &basisu::vector<basisu::image>::operator[](size_t) [T = basisu::image]";
        goto LAB_00213c30;
      }
      pgVar2 = (this->m_uastc_slice_textures).m_p;
      local_48 = uVar15 * 0x10;
      local_58 = pgVar2 + uVar15;
      local_50 = (this->m_slice_descs).m_p + uVar15;
      local_68 = pgVar2[uVar15].m_blocks_x;
      local_6c = pgVar2[uVar15].m_blocks_y;
      uVar14 = local_6c * local_68;
      local_38 = (this->m_slice_images).m_p + uVar15;
      LOCK();
      local_64 = 0;
      UNLOCK();
      local_40 = uVar15;
      if (uVar14 != 0) {
        uVar11 = 0;
        do {
          pbVar6 = local_60;
          uVar9 = uVar11 + 0x100;
          uVar12 = uVar9;
          if (uVar14 < uVar9) {
            uVar12 = uVar14;
          }
          pjVar5 = (local_60->m_params).m_pJob_pool;
          _local_88 = 0;
          local_90 = (undefined1  [8])operator_new(0x38);
          *(basis_compressor **)local_90 = pbVar6;
          *(uint *)((long)local_90 + 8) = uVar11;
          *(uint *)((long)local_90 + 0xc) = uVar12;
          *(uint32_t *)((long)local_90 + 0x10) = local_68;
          *(uint32_t *)((long)local_90 + 0x14) = local_6c;
          *(uint *)((long)local_90 + 0x18) = uVar14;
          *(image **)((long)local_90 + 0x20) = local_38;
          *(gpu_image **)((long)local_90 + 0x28) = local_58;
          *(undefined4 **)((long)local_90 + 0x30) = &local_64;
          local_78 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp:306:35)>
                     ::_M_invoke;
          local_80 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_comp.cpp:306:35)>
                     ::_M_manager;
          job_pool::add_job(pjVar5,(function<void_()> *)local_90);
          if (local_80 != (_Manager_type)0x0) {
            (*local_80)((_Any_data *)local_90,(_Any_data *)local_90,__destroy_functor);
          }
          uVar11 = uVar9;
        } while (uVar9 < uVar14);
      }
      this = local_60;
      job_pool::wait_for_all((local_60->m_params).m_pJob_pool);
      uVar15 = local_40;
      pgVar2 = local_58;
      if ((this->m_params).m_rdo_uastc.m_value != false) {
        local_80 = (code *)CONCAT71(local_80._1_7_,1);
        fStack_84 = (this->m_params).m_rdo_uastc_skip_block_rms_thresh.m_value;
        local_88 = (this->m_params).m_rdo_uastc_max_allowed_rms_increase_ratio.m_value;
        local_90._4_4_ = (this->m_params).m_rdo_uastc_quality_scalar.m_value;
        local_90._0_4_ = (this->m_params).m_rdo_uastc_dict_size.m_value;
        local_78 = (code *)CONCAT44(100,(this->m_params).m_rdo_uastc_max_smooth_block_error_scale.
                                        m_value);
        local_80 = (code *)CONCAT44((this->m_params).m_rdo_uastc_smooth_block_max_std_dev.m_value,
                                    (undefined4)local_80);
        if ((local_58->m_blocks).m_size == 0) {
LAB_00213ba8:
          __function = "T &basisu::vector<unsigned long>::operator[](size_t) [T = unsigned long]";
        }
        else {
          if (local_50->m_first_block_index < (this->m_source_blocks).m_size) {
            bVar7 = (this->m_params).m_rdo_uastc_multithreading.m_value;
            pjVar5 = (this->m_params).m_pJob_pool;
            total_jobs = 0;
            pJob_pool = (job_pool *)0x0;
            if (bVar7 != false) {
              pJob_pool = pjVar5;
            }
            if (((pjVar5 != (job_pool *)0x0 & bVar7) == 1) &&
               (total_jobs = (int)((ulong)((long)(pjVar5->m_threads).
                                                 super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(pjVar5->m_threads).
                                                super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1
               , 3 < total_jobs)) {
              total_jobs = 4;
            }
            bVar7 = uastc_rdo(local_58->m_blocks_y * local_58->m_blocks_x,
                              (uastc_block *)(local_58->m_blocks).m_p,
                              (color_rgba *)
                              ((this->m_source_blocks).m_p + local_50->m_first_block_index),
                              (uastc_rdo_params *)local_90,(this->m_params).m_pack_uastc_flags,
                              pJob_pool,total_jobs);
            if (!bVar7) {
              return cECFailedUASTCRDOPostProcess;
            }
            goto LAB_00213a62;
          }
          __function = 
          "T &basisu::vector<basisu::pixel_block>::operator[](size_t) [T = basisu::pixel_block]";
        }
        goto LAB_00213c30;
      }
LAB_00213a62:
      lVar13 = local_48;
      uVar14 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
      uVar11 = (uint)uVar15;
      if (uVar14 <= uVar11) {
LAB_00213bbf:
        __function = 
        "T &basisu::vector<basisu::vector<unsigned char>>::operator[](size_t) [T = basisu::vector<unsigned char>]"
        ;
        goto LAB_00213c30;
      }
      uVar12 = pgVar2->m_blocks_x * pgVar2->m_blocks_y * pgVar2->m_qwords_per_block * 8;
      uVar9 = *(uint *)((long)&this_02->m_p->m_size + local_48);
      this_03 = (elemental_vector *)((long)&this_02->m_p->m_p + local_48);
      if (uVar9 != uVar12) {
        if (uVar9 <= uVar12) {
          if (this_03->m_capacity < uVar12) {
            elemental_vector::increase_capacity
                      (this_03,uVar12,uVar9 + 1 == uVar12,1,(object_mover)0x0,false);
            uVar9 = this_03->m_size;
          }
          memset((void *)((ulong)uVar9 + (long)this_03->m_p),0,(ulong)(uVar12 - uVar9));
        }
        this_03->m_size = uVar12;
        uVar14 = (this->m_uastc_backend_output).m_slice_image_data.m_size;
      }
      if (uVar14 <= uVar11) goto LAB_00213bbf;
      if (*(int *)((long)&this_02->m_p->m_size + lVar13) == 0) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_00213c30;
      }
      if (((pgVar2->m_blocks).m_size == 0) ||
         (memcpy(*(void **)((long)&this_02->m_p->m_p + lVar13),(pgVar2->m_blocks).m_p,
                 (ulong)(pgVar2->m_blocks_x * pgVar2->m_blocks_y * pgVar2->m_qwords_per_block * 8)),
         (pgVar2->m_blocks).m_size == 0)) goto LAB_00213ba8;
      uVar8 = basist::crc16((pgVar2->m_blocks).m_p,
                            (ulong)(pgVar2->m_blocks_x * pgVar2->m_blocks_y *
                                    pgVar2->m_qwords_per_block * 8),0);
      if ((this->m_uastc_backend_output).m_slice_image_crcs.m_size <= uVar11) {
        __function = "T &basisu::vector<unsigned short>::operator[](size_t) [T = unsigned short]";
        goto LAB_00213c30;
      }
      (this->m_uastc_backend_output).m_slice_image_crcs.m_p[uVar15] = uVar8;
      uVar15 = (ulong)(uVar11 + 1);
    } while (uVar11 + 1 < (this->m_slice_descs).m_size);
  }
  return cECSuccess;
}

Assistant:

basis_compressor::error_code basis_compressor::encode_slices_to_uastc()
	{
		debug_printf("basis_compressor::encode_slices_to_uastc\n");

		m_uastc_slice_textures.resize(m_slice_descs.size());
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			m_uastc_slice_textures[slice_index].init(texture_format::cUASTC4x4, m_slice_descs[slice_index].m_orig_width, m_slice_descs[slice_index].m_orig_height);

		m_uastc_backend_output.m_tex_format = basist::basis_tex_format::cUASTC4x4;
		m_uastc_backend_output.m_etc1s = false;
		m_uastc_backend_output.m_slice_desc = m_slice_descs;
		m_uastc_backend_output.m_slice_image_data.resize(m_slice_descs.size());
		m_uastc_backend_output.m_slice_image_crcs.resize(m_slice_descs.size());
				
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			gpu_image& tex = m_uastc_slice_textures[slice_index];
			basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];
			(void)slice_desc;

			const uint32_t num_blocks_x = tex.get_blocks_x();
			const uint32_t num_blocks_y = tex.get_blocks_y();
			const uint32_t total_blocks = tex.get_total_blocks();
			const image& source_image = m_slice_images[slice_index];
			
			std::atomic<uint32_t> total_blocks_processed;
			total_blocks_processed = 0;

			const uint32_t N = 256;
			for (uint32_t block_index_iter = 0; block_index_iter < total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(total_blocks, block_index_iter + N);

				// FIXME: This sucks, but we're having a stack size related problem with std::function with emscripten.
#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, num_blocks_x, num_blocks_y, total_blocks, &source_image, &tex, &total_blocks_processed]
					{
#endif
						BASISU_NOTE_UNUSED(num_blocks_y);
						
						uint32_t uastc_flags = m_params.m_pack_uastc_flags;
						if ((m_params.m_rdo_uastc) && (m_params.m_rdo_uastc_favor_simpler_modes_in_rdo_mode))
							uastc_flags |= cPackUASTCFavorSimplerModes;

						for (uint32_t block_index = first_index; block_index < last_index; block_index++)
						{
							const uint32_t block_x = block_index % num_blocks_x;
							const uint32_t block_y = block_index / num_blocks_x;

							color_rgba block_pixels[4][4];

							source_image.extract_block_clamped((color_rgba*)block_pixels, block_x * 4, block_y * 4, 4, 4);

							basist::uastc_block& dest_block = *(basist::uastc_block*)tex.get_block_ptr(block_x, block_y);

							encode_uastc(&block_pixels[0][0].r, dest_block, uastc_flags);

							total_blocks_processed++;
							
							uint32_t val = total_blocks_processed;
							if ((val & 16383) == 16383)
							{
								debug_printf("basis_compressor::encode_slices_to_uastc: %3.1f%% done\n", static_cast<float>(val) * 100.0f / total_blocks);
							}

						}

#ifndef __EMSCRIPTEN__
					});
#endif

			} // block_index_iter

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			if (m_params.m_rdo_uastc)
			{
				uastc_rdo_params rdo_params;
				rdo_params.m_lambda = m_params.m_rdo_uastc_quality_scalar;
				rdo_params.m_max_allowed_rms_increase_ratio = m_params.m_rdo_uastc_max_allowed_rms_increase_ratio;
				rdo_params.m_skip_block_rms_thresh = m_params.m_rdo_uastc_skip_block_rms_thresh;
				rdo_params.m_lz_dict_size = m_params.m_rdo_uastc_dict_size;
				rdo_params.m_smooth_block_max_error_scale = m_params.m_rdo_uastc_max_smooth_block_error_scale;
				rdo_params.m_max_smooth_block_std_dev = m_params.m_rdo_uastc_smooth_block_max_std_dev;
								
				bool status = uastc_rdo(tex.get_total_blocks(), (basist::uastc_block*)tex.get_ptr(),
					(const color_rgba *)m_source_blocks[slice_desc.m_first_block_index].m_pixels, rdo_params, m_params.m_pack_uastc_flags, m_params.m_rdo_uastc_multithreading ? m_params.m_pJob_pool : nullptr,
					(m_params.m_rdo_uastc_multithreading && m_params.m_pJob_pool) ? basisu::minimum<uint32_t>(4, (uint32_t)m_params.m_pJob_pool->get_total_threads()) : 0);
				if (!status)
				{
					return cECFailedUASTCRDOPostProcess;
				}
			}

			m_uastc_backend_output.m_slice_image_data[slice_index].resize(tex.get_size_in_bytes());
			memcpy(&m_uastc_backend_output.m_slice_image_data[slice_index][0], tex.get_ptr(), tex.get_size_in_bytes());
			
			m_uastc_backend_output.m_slice_image_crcs[slice_index] = basist::crc16(tex.get_ptr(), tex.get_size_in_bytes(), 0);
						
		} // slice_index
				
		return cECSuccess;
	}